

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O3

void __thiscall gvr::PointCloud::savePLY(PointCloud *this,char *name,bool all,ply_encoding enc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ply_encoding pVar2;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_07;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_08;
  void *__buf_06;
  int __fd;
  string *psVar3;
  string *psVar4;
  string *psVar5;
  string *psVar6;
  long lVar7;
  PLYWriter ply;
  string local_298;
  PLYWriter local_278;
  
  psVar3 = &local_298;
  psVar4 = &local_298;
  psVar5 = &local_298;
  psVar6 = &local_298;
  pVar2 = enc;
  PLYWriter::PLYWriter(&local_278);
  PLYWriter::open(&local_278,name,enc);
  Model::setOriginToPLY(&this->super_Model,&local_278);
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"vertex","");
  PLYWriter::addElement(&local_278,&local_298,(long)this->n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"x","");
  PLYWriter::addProperty(&local_278,&local_298,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"y","");
  PLYWriter::addProperty(&local_278,&local_298,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"z","");
  PLYWriter::addProperty(&local_278,&local_298,ply_float32);
  __buf_06 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
    __buf_06 = extraout_RDX_00;
  }
  if (this->scanprop == (float *)0x0) {
    if (!all) goto LAB_00118ff0;
  }
  else {
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"scan_size","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    __buf_06 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
      __buf_06 = extraout_RDX_02;
    }
    psVar3 = psVar4;
    if (!all) goto LAB_00118ff0;
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"scan_error","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"scan_conf","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    __buf_06 = extraout_RDX_03;
    psVar3 = psVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
      __buf_06 = extraout_RDX_04;
      psVar3 = psVar5;
    }
  }
  if (this->scanpos != (float *)0x0) {
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"sx","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"sy","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"sz","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    __buf_06 = extraout_RDX_05;
    psVar3 = psVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
      __buf_06 = extraout_RDX_06;
      psVar3 = psVar6;
    }
  }
LAB_00118ff0:
  __fd = (int)psVar3;
  if (0 < this->n) {
    lVar7 = 0;
    do {
      PLYWriter::write(&local_278,(int)psVar3,__buf_06,CONCAT44(in_register_0000000c,pVar2));
      PLYWriter::write(&local_278,(int)psVar3,__buf,CONCAT44(in_register_0000000c,pVar2));
      PLYWriter::write(&local_278,(int)psVar3,__buf_00,CONCAT44(in_register_0000000c,pVar2));
      if (this->scanprop == (float *)0x0) {
        __buf_06 = __buf_01;
        if (all) goto LAB_0011909a;
      }
      else {
        PLYWriter::write(&local_278,(int)psVar3,__buf_01,CONCAT44(in_register_0000000c,pVar2));
        __buf_06 = __buf_02;
        if (all) {
          PLYWriter::write(&local_278,(int)psVar3,__buf_02,CONCAT44(in_register_0000000c,pVar2));
          PLYWriter::write(&local_278,(int)psVar3,__buf_03,CONCAT44(in_register_0000000c,pVar2));
          __buf_06 = extraout_RDX_07;
LAB_0011909a:
          if (this->scanpos != (float *)0x0) {
            PLYWriter::write(&local_278,(int)psVar3,__buf_06,CONCAT44(in_register_0000000c,pVar2));
            PLYWriter::write(&local_278,(int)psVar3,__buf_04,CONCAT44(in_register_0000000c,pVar2));
            PLYWriter::write(&local_278,(int)psVar3,__buf_05,CONCAT44(in_register_0000000c,pVar2));
            __buf_06 = extraout_RDX_08;
          }
        }
      }
      __fd = (int)psVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->n);
  }
  PLYWriter::close(&local_278,__fd);
  PLYWriter::~PLYWriter(&local_278);
  return;
}

Assistant:

void PointCloud::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  // define header

  ply.open(name, enc);

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }
  }

  ply.close();
}